

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O0

void __thiscall avro::Validator::setCount(Validator *this,int64_t count)

{
  undefined8 uVar1;
  string *msg;
  undefined8 in_RSI;
  long in_RDI;
  string *in_stack_ffffffffffffff68;
  Exception *in_stack_ffffffffffffff70;
  Exception *this_00;
  Validator *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
    uVar1 = __cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (allocator<char> *)in_stack_ffffffffffffffa0);
    Exception::Exception(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
  }
  if (*(long *)(in_RDI + 0x20) < 0) {
    msg = (string *)__cxa_allocate_exception(0x18);
    this_00 = (Exception *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (allocator<char> *)in_stack_ffffffffffffffa0);
    Exception::Exception(this_00,msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  *(undefined8 *)(in_RDI + 0x20) = in_RSI;
  doAdvance(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void
Validator::setCount(int64_t count) 
{
    if(!waitingForCount_) {
        throw Exception("Not expecting count");
    }
    else if(count_ < 0) {
        throw Exception("Count cannot be negative");
    }
    count_ = count;

    doAdvance();
}